

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferDataCase::testWithBufferSize
          (ModifyAfterWithBufferDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  code *pcVar1;
  deInt32 begin;
  deInt32 end;
  int iVar2;
  deInt32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  deUint64 dVar6;
  deUint64 dVar7;
  int local_5c;
  int local_4c;
  int repeatNdx;
  deUint64 endTime;
  deUint64 startTime;
  int newBufferSize;
  int largerBufferSize;
  Functions *gl;
  int drawEnd;
  int drawStart;
  int bufferSize_local;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *result_local;
  ModifyAfterWithBufferDataCase *this_local;
  
  begin = deAlign32(bufferSize / 4,0x10);
  end = deAlign32((bufferSize * 3) / 4,0x10);
  pRVar4 = Context::getRenderContext
                     ((this->
                      super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      .super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  dVar3 = deAlign32((int)((float)bufferSize * this->m_sizeDifferenceFactor),0x10);
  local_5c = bufferSize;
  if ((this->m_respecifySize & 1U) != 0) {
    local_5c = dVar3;
  }
  if ((this->m_repeatedUpload & 1U) != 0) {
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x150);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&(this->
                           super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                           ).m_zeroData,0);
      (*pcVar1)(0x8892,(long)local_5c,pvVar5,
                (this->
                super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ).m_bufferUsage);
      ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
      ::drawBufferRange(&this->
                         super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ,begin,end);
    }
  }
  dVar6 = deGetMicroseconds();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x150);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&(this->
                       super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       ).m_zeroData,0);
  (*pcVar1)(0x8892,(long)local_5c,pvVar5,
            (this->
            super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).m_bufferUsage);
  dVar7 = deGetMicroseconds();
  (result->duration).totalDuration = dVar7 - dVar6;
  (result->duration).fitResponseDuration = (result->duration).totalDuration;
  result->writtenSize = local_5c;
  return;
}

Assistant:

void ModifyAfterWithBufferDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					largerBufferSize	= deAlign32((int)((float)bufferSize * m_sizeDifferenceFactor), 4*4);
	const int					newBufferSize		= (m_respecifySize) ? (largerBufferSize) : (bufferSize);
	deUint64					startTime;
	deUint64					endTime;

	// repeat upload-draw
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferData(GL_ARRAY_BUFFER, newBufferSize, &m_zeroData[0], m_bufferUsage);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferData(GL_ARRAY_BUFFER, newBufferSize, &m_zeroData[0], m_bufferUsage);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = newBufferSize;
}